

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O2

void __thiscall FRandom::InitGenRand(FRandom *this,DWORD seed)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  (this->sfmt).u[0] = seed;
  iVar1 = 1;
  for (lVar2 = 7; lVar2 != 0x1a; lVar2 = lVar2 + 1) {
    iVar3 = (seed >> 0x1e ^ seed) * 0x6c078965;
    seed = iVar1 + iVar3;
    *(int *)((long)&this->Name + lVar2 * 4) = iVar3 + (int)lVar2 + -6;
    iVar1 = iVar1 + 1;
  }
  this->idx = 0x14;
  PeriodCertification(this);
  this->initialized = true;
  return;
}

Assistant:

void FRandom::InitGenRand(DWORD seed)
{
	int i;

	sfmt.u[idxof(0)] = seed;
	for (i = 1; i < SFMT::N32; i++)
	{
		sfmt.u[idxof(i)] = 1812433253UL * (sfmt.u[idxof(i - 1)] 
		^ (sfmt.u[idxof(i - 1)] >> 30))
			+ i;
	}
	idx = SFMT::N32;
	PeriodCertification();
#ifndef NDEBUG
	initialized = 1;
#endif
}